

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O3

deUint32 __thiscall
deqp::gles31::Functional::ComputeBuiltinVarCase::getProgram
          (ComputeBuiltinVarCase *this,UVec3 *localSize)

{
  deInt32 *pdVar1;
  DataType dataType;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar2;
  iterator iVar3;
  ShaderProgram *this_00;
  ostream *poVar4;
  char *__s;
  size_t sVar5;
  SharedPtrStateBase *pSVar6;
  mapped_type *pmVar7;
  TestError *this_01;
  deUint32 dVar8;
  long lVar9;
  ShaderProgramSp program;
  long *local_2c0;
  long local_2b8;
  long local_2b0 [2];
  uint local_2a0;
  value_type local_298;
  ProgramSources local_278;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  iVar3 = std::
          _Rb_tree<tcu::Vector<unsigned_int,_3>,_std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>,_std::_Select1st<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>,_deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>,_std::allocator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>_>
          ::find(&(this->m_progMap)._M_t,localSize);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->m_progMap)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (ShaderProgram *)operator_new(0xd0);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    memset(&local_278,0,0xac);
    local_278.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_278.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_278.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_278._193_8_ = 0;
    dataType = this->m_varType;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#version 310 es\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout (local_size_x = ",0x17);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", local_size_y = ",0x11);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", local_size_z = ",0x11);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") in;\n",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"uniform highp uvec2 u_stride;\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"layout(binding = 0) buffer Output\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    __s = glu::getDataTypeName(dataType);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," result[];\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} sb_out;\n",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "\thighp uint offset = u_stride.x*gl_GlobalInvocationID.z + u_stride.y*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tsb_out.result[offset] = ",0x19);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->m_varName)._M_dataplus._M_p,(this->m_varName)._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_2a0 = 5;
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_2c0,local_2b8 + (long)local_2c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_278.sources + local_2a0,&local_298);
    glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_278);
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_020e0ea0;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_2c0 != local_2b0) {
      operator_delete(local_2c0,local_2b0[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_278.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_278.attribLocationBindings);
    lVar9 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_278.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar9));
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != -0x18);
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,this_00)
    ;
    if ((this_00->m_program).m_info.linkOk == false) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Compile failed","");
      tcu::TestError::TestError(this_01,(string *)local_1a8);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pmVar7 = std::
             map<tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>,_deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>,_std::allocator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>_>
             ::operator[](&this->m_progMap,localSize);
    pSVar2 = pmVar7->m_state;
    if (pSVar2 != pSVar6) {
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSVar2->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pmVar7->m_ptr = (ShaderProgram *)0x0;
          (*pmVar7->m_state->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &pmVar7->m_state->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (pmVar7->m_state != (SharedPtrStateBase *)0x0) {
            (*pmVar7->m_state->_vptr_SharedPtrStateBase[1])();
          }
          pmVar7->m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pmVar7->m_ptr = this_00;
      pmVar7->m_state = pSVar6;
      if (pSVar6 == (SharedPtrStateBase *)0x0) {
        return (this_00->m_program).m_program;
      }
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &pmVar7->m_state->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    dVar8 = (this_00->m_program).m_program;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar6->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (*pSVar6->_vptr_SharedPtrStateBase[2])(pSVar6);
      }
      LOCK();
      pdVar1 = &pSVar6->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (pSVar6 != (SharedPtrStateBase *)0x0)) {
        (*pSVar6->_vptr_SharedPtrStateBase[1])();
      }
    }
  }
  else {
    dVar8 = *(deUint32 *)&iVar3._M_node[1]._M_left[4]._M_right;
  }
  return dVar8;
}

Assistant:

deUint32 ComputeBuiltinVarCase::getProgram (const UVec3& localSize)
{
	LocalSizeProgramMap::const_iterator cachePos = m_progMap.find(localSize);
	if (cachePos != m_progMap.end())
		return cachePos->second->getProgram();
	else
	{
		ShaderProgramSp program(new ShaderProgram(m_context.getRenderContext(),
												  ProgramSources() << ComputeSource(genBuiltinVarSource(m_varName, m_varType, localSize))));

		// Log all compiled programs.
		m_testCtx.getLog() << *program;
		if (!program->isOk())
			throw tcu::TestError("Compile failed");

		m_progMap[localSize] = program;
		return program->getProgram();
	}
}